

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog_set.cpp
# Opt level: O2

bool __thiscall
duckdb::CatalogSet::VerifyVacancy
          (CatalogSet *this,CatalogTransaction transaction,CatalogEntry *entry)

{
  ulong uVar1;
  TransactionException *this_00;
  allocator local_59;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string local_38;
  
  uVar1 = (entry->timestamp).super___atomic_base<unsigned_long>._M_i;
  if (((uVar1 < 0x4000000000000060) || (transaction.transaction_id == uVar1)) &&
     ((0x400000000000005f < uVar1 || (uVar1 <= transaction.start_time)))) {
    return entry->deleted;
  }
  this_00 = (TransactionException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_38,"Catalog write-write conflict on create with \"%s\"",&local_59);
  ::std::__cxx11::string::string((string *)&local_58,(string *)&entry->name);
  TransactionException::TransactionException<std::__cxx11::string>(this_00,&local_38,&local_58);
  __cxa_throw(this_00,&TransactionException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

bool CatalogSet::VerifyVacancy(CatalogTransaction transaction, CatalogEntry &entry) {
	if (HasConflict(transaction, entry.timestamp)) {
		// A transaction that is not visible to our snapshot has already made a change to this entry.
		// Because of Catalog limitations we can't push our change on this, even if the change was made by another
		// active transaction that might end up being aborted. So we have to cancel this transaction.
		throw TransactionException("Catalog write-write conflict on create with \"%s\"", entry.name);
	}
	// The entry is visible to our snapshot
	if (!entry.deleted) {
		return false;
	}
	return true;
}